

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O3

exr_result_t
internal_decode_alloc_buffer
          (exr_decode_pipeline_t *decode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *cursz,size_t newsz)

{
  exr_result_t eVar1;
  void *pvVar2;
  int iVar3;
  exr_const_context_t p_Var4;
  code *UNRECOVERED_JUMPTABLE;
  
  if (newsz == 0) {
    return 0;
  }
  if ((*buf != (void *)0x0) && (newsz <= *cursz)) {
    return 0;
  }
  internal_decode_free_buffer(decode,bufid,buf,cursz);
  if (decode->alloc_fn == (_func_void_ptr_exr_transcoding_pipeline_buffer_id_t_size_t *)0x0) {
    p_Var4 = decode->context;
    if (p_Var4 == (exr_const_context_t)0x0) {
      return 2;
    }
    iVar3 = decode->part_index;
    if ((iVar3 < 0) || (*(int *)(p_Var4 + 0xc4) <= iVar3)) {
      UNRECOVERED_JUMPTABLE = *(code **)(p_Var4 + 0x48);
      goto LAB_00123532;
    }
    pvVar2 = (void *)(**(code **)(p_Var4 + 0x58))(newsz);
  }
  else {
    pvVar2 = (*decode->alloc_fn)(bufid,newsz);
  }
  if (pvVar2 != (void *)0x0) {
    *buf = pvVar2;
    *cursz = newsz;
    return 0;
  }
  p_Var4 = decode->context;
  if (p_Var4 == (exr_const_context_t)0x0) {
    return 2;
  }
  iVar3 = decode->part_index;
  if ((-1 < iVar3) && (iVar3 < *(int *)(p_Var4 + 0xc4))) {
    eVar1 = (**(code **)(p_Var4 + 0x48))
                      (p_Var4,1,"Unable to allocate %lu bytes",newsz,*(code **)(p_Var4 + 0x48));
    return eVar1;
  }
  UNRECOVERED_JUMPTABLE = *(code **)(p_Var4 + 0x48);
LAB_00123532:
  eVar1 = (*UNRECOVERED_JUMPTABLE)
                    (p_Var4,4,"Part index (%d) out of range",iVar3,UNRECOVERED_JUMPTABLE);
  return eVar1;
}

Assistant:

exr_result_t
internal_decode_alloc_buffer (
    exr_decode_pipeline_t*               decode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              cursz,
    size_t                               newsz)
{
    void* curbuf = *buf;

    /* We might have a zero size here due to y sampling on a scanline
     * image where there is an attempt to read that portion of the
     * image. Just shortcut here and handle at a higher level where
     * there is more context
     */
    if (newsz == 0) return EXR_ERR_SUCCESS;

    if (!curbuf || *cursz < newsz)
    {
        internal_decode_free_buffer (decode, bufid, buf, cursz);

        if (decode->alloc_fn)
            curbuf = (uint8_t*) decode->alloc_fn (bufid, newsz);
        else
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                decode->context, decode->part_index);

            curbuf = (uint8_t*) pctxt->alloc_fn (newsz);
        }

        if (curbuf == NULL)
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                decode->context, decode->part_index);

            return pctxt->print_error (
                pctxt,
                EXR_ERR_OUT_OF_MEMORY,
                "Unable to allocate %" PRIu64 " bytes",
                (uint64_t) newsz);
        }

        *buf   = curbuf;
        *cursz = newsz;
    }
    return EXR_ERR_SUCCESS;
}